

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

int addListItemsToUnsubscribePacket
              (BUFFER_HANDLE ctrlPacket,char **payloadList,size_t payloadCount,
              STRING_HANDLE trace_log)

{
  int iVar1;
  uchar *local_50;
  uint8_t *iterator;
  size_t topicLen;
  size_t offsetLen;
  size_t index;
  STRING_HANDLE pSStack_28;
  int result;
  STRING_HANDLE trace_log_local;
  size_t payloadCount_local;
  char **payloadList_local;
  BUFFER_HANDLE ctrlPacket_local;
  
  index._4_4_ = 0;
  pSStack_28 = trace_log;
  trace_log_local = (STRING_HANDLE)payloadCount;
  payloadCount_local = (size_t)payloadList;
  payloadList_local = (char **)ctrlPacket;
  for (offsetLen = 0; offsetLen < trace_log_local && index._4_4_ == 0; offsetLen = offsetLen + 1) {
    topicLen = BUFFER_length((BUFFER_HANDLE)payloadList_local);
    iterator = (uint8_t *)strlen(*(char **)(payloadCount_local + offsetLen * 8));
    if (iterator < (uint8_t *)0x10000) {
      iVar1 = BUFFER_enlarge((BUFFER_HANDLE)payloadList_local,(size_t)(iterator + 2));
      if (iVar1 == 0) {
        local_50 = BUFFER_u_char((BUFFER_HANDLE)payloadList_local);
        local_50 = local_50 + topicLen;
        byteutil_writeUTF(&local_50,*(char **)(payloadCount_local + offsetLen * 8),
                          (uint16_t)iterator);
      }
      else {
        index._4_4_ = 0x93;
      }
    }
    else {
      index._4_4_ = 0x8f;
    }
    if (pSStack_28 != (STRING_HANDLE)0x0) {
      STRING_sprintf(pSStack_28," | TOPIC_NAME: %s",
                     *(undefined8 *)(payloadCount_local + offsetLen * 8));
    }
  }
  return index._4_4_;
}

Assistant:

static int addListItemsToUnsubscribePacket(BUFFER_HANDLE ctrlPacket, const char** payloadList, size_t payloadCount, STRING_HANDLE trace_log)
{
    int result = 0;
    size_t index = 0;
    for (index = 0; index < payloadCount && result == 0; index++)
    {
        // Add the Payload
        size_t offsetLen = BUFFER_length(ctrlPacket);
        size_t topicLen = strlen(payloadList[index]);
        if (topicLen > USHRT_MAX)
        {
            result = MU_FAILURE;
        }
        else if (BUFFER_enlarge(ctrlPacket, topicLen + 2) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            uint8_t* iterator = BUFFER_u_char(ctrlPacket);
            iterator += offsetLen;
            byteutil_writeUTF(&iterator, payloadList[index], (uint16_t)topicLen);
        }
        if (trace_log != NULL)
        {
            STRING_sprintf(trace_log, " | TOPIC_NAME: %s", payloadList[index]);
        }
    }
    return result;
}